

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_legacy.cpp
# Opt level: O3

RK_S32 __thiscall
VpuApiLegacy::encoder_sendframe
          (VpuApiLegacy *this,VpuCodecContext *ctx,EncInputStream_t *aEncInStrm)

{
  RK_U32 height;
  uint uVar1;
  RK_S64 RVar2;
  undefined8 uVar3;
  MPP_RET MVar4;
  uint uVar5;
  int iVar6;
  MppMeta meta;
  RK_U8 *dst;
  char *pcVar7;
  uint uVar8;
  undefined8 uVar9;
  MppFrameFormat MVar10;
  uint uVar11;
  ulong uVar12;
  MppFrame frame;
  EncInputStream_t *local_80;
  ulong local_78;
  ulong local_70;
  undefined1 local_68 [16];
  MppBufferInfo inputCommit;
  
  if (((byte)vpu_api_debug & 1) != 0) {
    _mpp_log_l(4,"vpu_api_legacy","enter\n","encoder_sendframe");
  }
  uVar5 = ctx->width;
  height = ctx->height;
  RVar2 = aEncInStrm->timeUs;
  local_68._8_8_ = ZEXT48((uint)aEncInStrm->size);
  uVar1 = aEncInStrm->bufPhyAddr;
  frame = (MppFrame)0x0;
  MVar4 = mpp_frame_init();
  if (MVar4 != MPP_OK) {
    _mpp_log_l(2,"vpu_api_legacy","mpp_frame_init failed\n","encoder_sendframe");
    goto LAB_001085db;
  }
  uVar8 = uVar5 + 0xf & 0xfffffff0;
  uVar11 = height + 7 & 0xfffffff8;
  local_80 = aEncInStrm;
  local_78 = (ulong)uVar1;
  local_70 = (ulong)uVar5;
  mpp_frame_set_width(frame,uVar5);
  mpp_frame_set_height(frame,height);
  mpp_frame_set_ver_stride(frame,uVar11);
  mpp_frame_set_pts(frame,RVar2);
  uVar3 = local_68._8_8_;
  MVar10 = this->format & 0xfffff;
  uVar5 = MVar10 - MPP_FMT_RGB565;
  if (uVar5 < 0xe) {
    if ((0xfU >> (uVar5 & 0x1f) & 1) == 0) {
      if ((0x3c00U >> (uVar5 & 0x1f) & 1) == 0) {
        if ((0xc0U >> (uVar5 & 0x1f) & 1) == 0) goto LAB_001086d6;
        uVar5 = uVar8 * 3;
      }
      else {
        uVar5 = uVar8 * 4;
      }
    }
    else {
      uVar5 = uVar8 * 2;
    }
LAB_001086f5:
    mpp_frame_set_hor_stride(frame,uVar5);
  }
  else {
LAB_001086d6:
    if ((MVar10 < MPP_FMT_YUV422P) &&
       (uVar5 = uVar8, (0x31U >> (this->format & (MPP_FMT_YUV444P|MPP_FMT_YUV444SP)) & 1) != 0))
    goto LAB_001086f5;
    _mpp_log_l(2,"vpu_api_legacy","unsupport format 0x%x\n",0);
  }
  mpp_frame_set_fmt(frame,this->format & 0xfffff);
  if (local_80->nFlags != 0) {
    _mpp_log_l(4,"vpu_api_legacy","found eos true\n","encoder_sendframe");
    mpp_frame_set_eos(frame,1);
  }
  if (uVar3 == 0) {
    mpp_frame_set_buffer(frame,0);
    uVar12 = local_78;
    if (local_80->nFlags == 0) {
      _mpp_log_l(2,"vpu_api_legacy","found empty frame without eos flag set!\n","encoder_sendframe")
      ;
    }
LAB_0010892e:
    if (((byte)vpu_api_debug & 0x10) != 0) {
      _mpp_log_l(4,"vpu_api_legacy","w %d h %d input fd %d size %d pts %lld, flag %d \n",
                 "encoder_sendframe",local_70,height,uVar12,uVar3,local_80->timeUs,local_80->nFlags)
      ;
    }
    if (this->mlvec != (VpuApiMlvec)0x0) {
      meta = (MppMeta)mpp_frame_get_meta(frame);
      vpu_api_mlvec_set_dy_cfg(this->mlvec,&this->mlvec_dy_cfg,meta);
    }
    MVar4 = (*this->mpi->encode_put_frame)(this->mpp_ctx,frame);
    if (MVar4 == MPP_OK) {
      local_80->size = 0;
      MVar4 = MPP_OK;
    }
    else {
      _mpp_log_l(2,"vpu_api_legacy","encode_put_frame ret %d\n","encoder_sendframe",MVar4);
    }
  }
  else {
    iVar6 = this->fd_input;
    if (iVar6 < 0) {
      iVar6 = is_valid_dma_fd((int)local_78);
      this->fd_input = iVar6;
    }
    uVar12 = local_78;
    if (iVar6 == 0) {
      if (local_80->buf == (RK_U8 *)0x0) {
        MVar4 = MPP_ERR_NULL_PTR;
        goto LAB_001085db;
      }
      MVar10 = this->format;
      if (MVar10 < MPP_FMT_YUV_BUTT) {
        uVar5 = uVar8 * (uVar11 + 0xf & 0xfffffff0) * 3 >> 1;
      }
      else if (MVar10 - MPP_FMT_RGB565 < 7) {
        uVar5 = uVar8 * (uVar11 + 0xf & 0xfffffff0) * 3;
      }
      else {
        if ((MVar10 & ~MPP_FMT_YUV422SP_VU) != MPP_FMT_RGB101010) {
          _mpp_log_l(2,"vpu_api_legacy","unsupport input format:%d\n","encoder_sendframe");
          MVar4 = MPP_NOK;
          goto LAB_001085db;
        }
        uVar5 = uVar8 * (uVar11 + 0xf & 0x3ffffff0) * 4;
      }
      if (uVar5 == 0) goto LAB_0010892e;
      inputCommit.type = MPP_BUFFER_TYPE_NORMAL;
      inputCommit._4_4_ = 0;
      MVar4 = mpp_buffer_get_with_tag
                        (this->memGroup,&inputCommit,uVar5,"vpu_api_legacy","encoder_sendframe");
      if (MVar4 == MPP_OK) {
        dst = (RK_U8 *)mpp_buffer_get_ptr_with_caller(inputCommit._0_8_,"encoder_sendframe");
        copy_align_raw_buffer_to_dest(dst,local_80->buf,(RK_U32)local_70,height,this->format);
        mpp_frame_set_buffer(frame,inputCommit._0_8_);
        uVar9 = inputCommit._0_8_;
        uVar12 = local_78;
        goto LAB_0010886d;
      }
      pcVar7 = "allocate input picture buffer failed\n";
    }
    else {
      inputCommit.ptr = (void *)0x0;
      inputCommit.hnd = (void *)0x0;
      inputCommit.type = MPP_BUFFER_TYPE_ION;
      inputCommit._4_4_ = 0;
      inputCommit.size = uVar3;
      inputCommit._32_8_ = local_78 & 0xffffffff;
      local_68._0_8_ = 0;
      MVar4 = mpp_buffer_import_with_tag
                        (0,&inputCommit,local_68,"vpu_api_legacy","encoder_sendframe");
      if (MVar4 == MPP_OK) {
        mpp_frame_set_buffer(frame,local_68._0_8_);
        uVar9 = local_68._0_8_;
LAB_0010886d:
        mpp_buffer_put_with_caller(uVar9,"encoder_sendframe");
        goto LAB_0010892e;
      }
      pcVar7 = "import input picture buffer failed\n";
    }
    _mpp_log_l(2,"vpu_api_legacy",pcVar7,"encoder_sendframe");
  }
LAB_001085db:
  if (frame != (MppFrame)0x0) {
    mpp_frame_deinit(&frame);
  }
  if (((byte)vpu_api_debug & 1) != 0) {
    _mpp_log_l(4,"vpu_api_legacy","leave ret %d\n","encoder_sendframe",MVar4);
  }
  return MVar4;
}

Assistant:

RK_S32 VpuApiLegacy::encoder_sendframe(VpuCodecContext *ctx, EncInputStream_t *aEncInStrm)
{
    RK_S32 ret = 0;
    vpu_api_dbg_func("enter\n");

    RK_U32 width        = ctx->width;
    RK_U32 height       = ctx->height;
    RK_U32 hor_stride   = MPP_ALIGN(width,  16);
    RK_U32 ver_stride   = MPP_ALIGN(height, 8);
    RK_S64 pts          = aEncInStrm->timeUs;
    RK_S32 fd           = aEncInStrm->bufPhyAddr;
    RK_U32 size         = aEncInStrm->size;

    /* try import input buffer and output buffer */
    MppFrame frame = NULL;

    ret = mpp_frame_init(&frame);
    if (MPP_OK != ret) {
        mpp_err_f("mpp_frame_init failed\n");
        goto FUNC_RET;
    }

    mpp_frame_set_width(frame, width);
    mpp_frame_set_height(frame, height);
    mpp_frame_set_ver_stride(frame, ver_stride);
    mpp_frame_set_pts(frame, pts);
    switch (format & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420P :
    case MPP_FMT_YUV420SP :
    case MPP_FMT_YUV420SP_VU : {
        mpp_frame_set_hor_stride(frame, hor_stride);
    } break;
    case MPP_FMT_RGB565:
    case MPP_FMT_BGR565:
    case MPP_FMT_RGB555:
    case MPP_FMT_BGR555: {
        mpp_frame_set_hor_stride(frame, hor_stride * 2);
    } break;
    case MPP_FMT_RGB888 :
    case MPP_FMT_BGR888 : {
        mpp_frame_set_hor_stride(frame, hor_stride * 3);
    } break;
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGBA8888 : {
        mpp_frame_set_hor_stride(frame, hor_stride * 4);
    } break;
    default: {
        mpp_err("unsupport format 0x%x\n", format & MPP_FRAME_FMT_MASK);
    } break;
    }
    mpp_frame_set_fmt(frame, (MppFrameFormat)(format & MPP_FRAME_FMT_MASK));
    if (aEncInStrm->nFlags) {
        mpp_log_f("found eos true\n");
        mpp_frame_set_eos(frame, 1);
    }

    if (size <= 0) {
        mpp_frame_set_buffer(frame, NULL);
        if (!aEncInStrm->nFlags)
            mpp_err_f("found empty frame without eos flag set!\n");
        goto PUT_FRAME;
    }

    if (fd_input < 0) {
        fd_input = is_valid_dma_fd(fd);
    }
    if (fd_input) {
        MppBufferInfo   inputCommit;

        memset(&inputCommit, 0, sizeof(inputCommit));
        inputCommit.type = MPP_BUFFER_TYPE_ION;
        inputCommit.size = size;
        inputCommit.fd = fd;
        if (size > 0) {
            MppBuffer buffer = NULL;
            ret = mpp_buffer_import(&buffer, &inputCommit);
            if (ret) {
                mpp_err_f("import input picture buffer failed\n");
                goto FUNC_RET;
            }
            mpp_frame_set_buffer(frame, buffer);
            mpp_buffer_put(buffer);
            buffer = NULL;
        }
    } else {
        RK_U32 align_size   = 0;

        if (NULL == aEncInStrm->buf) {
            ret = MPP_ERR_NULL_PTR;
            goto FUNC_RET;
        }
        if (format >= MPP_FMT_YUV420SP && format < MPP_FMT_YUV_BUTT) {
            align_size = hor_stride * MPP_ALIGN(ver_stride, 16) * 3 / 2;
        } else  if (format >= MPP_FMT_YUV420SP_VU && format < MPP_FMT_YUV_BUTT) {
            align_size = hor_stride * MPP_ALIGN(ver_stride, 16) * 3 / 2;
        } else if (format >= MPP_FMT_RGB565 && format < MPP_FMT_BGR888) {
            align_size = hor_stride * MPP_ALIGN(ver_stride, 16) * 3;
        } else if (format >= MPP_FMT_RGB101010 && format < MPP_FMT_RGB_BUTT) {
            align_size = hor_stride * MPP_ALIGN(ver_stride, 16) * 4;
        } else {
            mpp_err_f("unsupport input format:%d\n", format);
            ret = MPP_NOK;
            goto FUNC_RET;
        }
        if (align_size > 0) {
            MppBuffer buffer = NULL;
            ret = mpp_buffer_get(memGroup, &buffer, align_size);
            if (ret) {
                mpp_err_f("allocate input picture buffer failed\n");
                goto FUNC_RET;
            }
            copy_align_raw_buffer_to_dest((RK_U8 *)mpp_buffer_get_ptr(buffer),
                                          aEncInStrm->buf, width, height, format);
            mpp_frame_set_buffer(frame, buffer);
            mpp_buffer_put(buffer);
            buffer = NULL;
        }
    }

PUT_FRAME:

    vpu_api_dbg_input("w %d h %d input fd %d size %d pts %lld, flag %d \n",
                      width, height, fd, size, aEncInStrm->timeUs, aEncInStrm->nFlags);
    if (mlvec) {
        MppMeta meta = mpp_frame_get_meta(frame);

        vpu_api_mlvec_set_dy_cfg(mlvec, &mlvec_dy_cfg, meta);
    }

    ret = mpi->encode_put_frame(mpp_ctx, frame);
    if (ret)
        mpp_err_f("encode_put_frame ret %d\n", ret);
    else
        aEncInStrm->size = 0;

FUNC_RET:
    if (frame)
        mpp_frame_deinit(&frame);

    vpu_api_dbg_func("leave ret %d\n", ret);
    return ret;
}